

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Miter2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  Gia_Man_t *pNew;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (argc - globalUtilOptind == 1) {
      pcVar3 = argv[globalUtilOptind];
      pcVar2 = pcVar3;
      do {
        if (*pcVar2 == '>') {
          *pcVar2 = '\\';
        }
        else if (*pcVar2 == '\0') {
          __stream = fopen(pcVar3,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar3);
            pcVar3 = Extra_FileGetSimilarName
                               (pcVar3,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
            if (pcVar3 != (char *)0x0) {
              Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
            }
            Abc_Print(1,"\n");
            return 1;
          }
          fclose(__stream);
          pcVar3 = Extra_FileReadContents(pcVar3);
          Extra_StringClean(pcVar3,"01xX");
          sVar4 = strlen(pcVar3);
          if (pAbc->pGia->vCis->nSize != (int)sVar4) {
            Abc_Print(-1,"Init string length (%d) differs from PI and flop count (%d).\n",sVar4);
            free(pcVar3);
            return 1;
          }
          pNew = Gia_ManMiter2(pAbc->pGia,pcVar3,fVerbose);
          free(pcVar3);
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar2 = pcVar2 + 1;
      } while( true );
    }
    pcVar3 = "File name is not given on the command line.\n";
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: &miter2 [-vh] <file>\n");
    Abc_Print(-2,"\t         creates miter of two copies of the design\n");
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar3 = "\t<file> : file name with flop initial values (0/1/x/X) [default = required]\n";
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Miter2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    char * FileName, * pTemp, * pInit;
    char ** pArgvNew;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    // extract string
    pInit = Extra_FileReadContents( FileName );
    Extra_StringClean( pInit, "01xX" );
    if ( (int)strlen(pInit) != Gia_ManCiNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Init string length (%d) differs from PI and flop count (%d).\n", strlen(pInit), Gia_ManCiNum(pAbc->pGia) );
        ABC_FREE( pInit );
        return 1;
    }
    // compute the miter
    pAux = Gia_ManMiter2( pAbc->pGia, pInit, fVerbose );
    ABC_FREE( pInit );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter2 [-vh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two copies of the design\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with flop initial values (0/1/x/X) [default = required]\n" );
    return 1;
}